

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

vector<sfc::Image,_std::allocator<sfc::Image>_> * __thiscall
sfc::Image::crops(vector<sfc::Image,_std::allocator<sfc::Image>_> *__return_storage_ptr__,
                 Image *this,uint tile_width,uint tile_height,Mode mode)

{
  uint x;
  uint y;
  Image local_b8;
  
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<sfc::Image,_std::allocator<sfc::Image>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (y = 0; y < this->_height; y = y + tile_height) {
    for (x = 0; x < this->_width; x = x + tile_width) {
      crop(&local_b8,this,x,y,tile_width,tile_height,mode);
      std::vector<sfc::Image,_std::allocator<sfc::Image>_>::emplace_back<sfc::Image>
                (__return_storage_ptr__,&local_b8);
      ~Image(&local_b8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> Image::crops(unsigned tile_width, unsigned tile_height, Mode mode) const {
  std::vector<Image> v;
  unsigned x = 0;
  unsigned y = 0;
  while (y < _height) {
    while (x < _width) {
      v.push_back(crop(x, y, tile_width, tile_height, mode));
      x += tile_width;
    }
    x = 0;
    y += tile_height;
  }
  return v;
}